

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

size_type __thiscall wabt::string_view::find(string_view *this,char c,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  char local_9;
  
  uVar1 = this->size_;
  if (uVar1 < pos) {
    pos = uVar1;
  }
  local_9 = c;
  pcVar2 = std::__search<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                     (this->data_ + pos,this->data_ + uVar1,&local_9);
  sVar3 = 0xffffffffffffffff;
  if (pcVar2 != this->data_ + this->size_) {
    sVar3 = (long)pcVar2 - (long)this->data_;
  }
  return sVar3;
}

Assistant:

string_view::size_type string_view::find(char c, size_type pos) const noexcept {
  return find(string_view(&c, 1), pos);
}